

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall
ev3dev::i2c_sensor::i2c_sensor
          (i2c_sensor *this,address_type *address,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types)

{
  address_type aStack_38;
  
  std::__cxx11::string::string((string *)&aStack_38,(string *)address);
  sensor::sensor(&this->super_sensor,&aStack_38,types);
  std::__cxx11::string::~string((string *)&aStack_38);
  return;
}

Assistant:

i2c_sensor::i2c_sensor(address_type address, const std::set<sensor_type> &types)
    : sensor(address, types)
{ }